

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_public.c
# Opt level: O0

nng_err nng_http_server_add_handler(nng_http_server *srv,nng_http_handler *h)

{
  nng_err nVar1;
  nng_http_handler *h_local;
  nng_http_server *srv_local;
  
  nVar1 = nni_http_server_add_handler(srv,h);
  return nVar1;
}

Assistant:

nng_err
nng_http_server_add_handler(nng_http_server *srv, nng_http_handler *h)
{
#ifdef NNG_SUPP_HTTP
	return (nni_http_server_add_handler(srv, h));
#else
	NNI_ARG_UNUSED(srv);
	NNI_ARG_UNUSED(h);
	return (NNG_ENOTSUP);
#endif
}